

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsthandl.c
# Opt level: O1

LispPTR N_OP_listget(LispPTR plist,LispPTR tos)

{
  LispPTR LVar1;
  cadr_cell cVar2;
  LispPTR datum;
  LispPTR parm;
  ulong uVar3;
  
  uVar3 = (ulong)plist;
  while( true ) {
    LVar1 = (LispPTR)uVar3;
    if (LVar1 == 0) {
      return 0;
    }
    if ((*(ushort *)((ulong)((uint)(uVar3 >> 8) & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 5) {
      MachineState.tosvalue = tos;
      MachineState.scratch_cstk = LVar1;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    cVar2 = cadr(LVar1);
    datum = cVar2.cdr_cell;
    if (cVar2.car_cell == tos) break;
    if ((*(ushort *)((ulong)(datum >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 5) {
      return 0;
    }
    cVar2 = cadr(datum);
    uVar3 = (ulong)cVar2 >> 0x20;
    if (MachineState.irqend == 0) {
      MachineState.errorexit = 1;
      MachineState.scratch_cstk = cVar2.cdr_cell;
      MachineState.tosvalue = tos;
      return 0xfffffffe;
    }
  }
  if (datum == 0) {
    return 0;
  }
  if ((*(ushort *)((ulong)(datum >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 5) {
    MachineState.tosvalue = tos;
    MachineState.scratch_cstk = LVar1;
    MachineState.errorexit = 1;
    return 0xffffffff;
  }
  LVar1 = car(datum);
  return LVar1;
}

Assistant:

LispPTR N_OP_listget(LispPTR plist, LispPTR tos) {
  struct cadr_cell cadrobj;

  while (plist != NIL_PTR) {
    S_N_CHECKANDCADR2(plist, cadrobj, tos, plist);

    if (cadrobj.car_cell == tos) {
      if (cadrobj.cdr_cell == NIL_PTR) return NIL_PTR;

      if (Listp(cadrobj.cdr_cell))
        return (car(cadrobj.cdr_cell));
      else /* must punt in case car/cdrerr */
        SAVE_ERROR_EXIT2(plist, tos);
    }

    if (!Listp(cadrobj.cdr_cell)) { /* this list ended before we found prop */
      return (NIL_PTR);
    }

    S_N_CHECKANDCADR2(cadrobj.cdr_cell, cadrobj, tos, plist);
    plist = cadrobj.cdr_cell;

    if (!Irq_Stk_End) {
      /* for continuation, it becomes plist on next time */
      Scratch_CSTK = plist;
      TIMER_EXIT(tos);
    }
  }

  return (NIL_PTR);

}